

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.c
# Opt level: O0

mz_bool mz_zip_reader_extract_to_file
                  (mz_zip_archive *pZip,mz_uint file_index,char *pDst_filename,mz_uint flags)

{
  mz_bool mVar1;
  int iVar2;
  FILE *__stream;
  char *in_RDX;
  FILE *pFile;
  mz_zip_archive_file_stat file_stat;
  mz_bool status;
  mz_uint in_stack_00002b7c;
  void *in_stack_00002b80;
  mz_file_write_func in_stack_00002b88;
  mz_uint in_stack_00002b94;
  mz_zip_archive *in_stack_00002b98;
  time_t in_stack_fffffffffffffd90;
  mz_zip_archive_file_stat *in_stack_fffffffffffffd98;
  undefined4 in_stack_fffffffffffffda0;
  mz_uint in_stack_fffffffffffffda4;
  mz_zip_archive *in_stack_fffffffffffffda8;
  mz_bool local_4;
  
  mVar1 = mz_zip_reader_file_stat
                    (in_stack_fffffffffffffda8,in_stack_fffffffffffffda4,in_stack_fffffffffffffd98);
  if (mVar1 == 0) {
    local_4 = 0;
  }
  else {
    __stream = fopen64(in_RDX,"wb");
    if (__stream == (FILE *)0x0) {
      local_4 = 0;
    }
    else {
      local_4 = mz_zip_reader_extract_to_callback
                          (in_stack_00002b98,in_stack_00002b94,in_stack_00002b88,in_stack_00002b80,
                           in_stack_00002b7c);
      iVar2 = fclose(__stream);
      if (iVar2 == -1) {
        local_4 = 0;
      }
      else if (local_4 != 0) {
        mz_zip_set_file_times
                  ((char *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
                   (time_t)in_stack_fffffffffffffd98,in_stack_fffffffffffffd90);
      }
    }
  }
  return local_4;
}

Assistant:

mz_bool mz_zip_reader_extract_to_file(mz_zip_archive *pZip, mz_uint file_index, const char *pDst_filename, mz_uint flags)
{
  mz_bool status;
  mz_zip_archive_file_stat file_stat;
  MZ_FILE *pFile;
  if (!mz_zip_reader_file_stat(pZip, file_index, &file_stat))
    return MZ_FALSE;
  pFile = MZ_FOPEN(pDst_filename, "wb");
  if (!pFile)
    return MZ_FALSE;
  status = mz_zip_reader_extract_to_callback(pZip, file_index, mz_zip_file_write_callback, pFile, flags);
  if (MZ_FCLOSE(pFile) == EOF)
    return MZ_FALSE;
#ifndef MINIZ_NO_TIME
  if (status)
    mz_zip_set_file_times(pDst_filename, file_stat.m_time, file_stat.m_time);
#endif
  return status;
}